

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void nlohmann::
     json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
     ::unescape(string *s)

{
  string *s_00;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  string *local_10;
  string *s_local;
  
  local_10 = s;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"~1",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"/",&local_69);
  replace_substring(s,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  s_00 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"~0",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"~",&local_b9);
  replace_substring(s_00,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  return;
}

Assistant:

static void unescape(std::string& s) {
		replace_substring(s, "~1", "/");
		replace_substring(s, "~0", "~");
	}